

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

int __thiscall rcg::Device::getAvailableModuleEvents(Device *this)

{
  mutex *__mutex;
  int iVar1;
  GC_ERROR GVar2;
  undefined8 uVar3;
  size_t ret;
  size_t size;
  INFO_DATATYPE type;
  undefined8 local_30;
  size_t local_28;
  INFO_DATATYPE local_1c;
  
  __mutex = &this->mtx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_30 = 0;
    local_28 = 8;
    iVar1 = 0;
    if (this->event != (EVENT_HANDLE)0x0) {
      GVar2 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                EventGetInfo)(this->event,1,&local_1c,&local_30,&local_28);
      iVar1 = 0;
      if (GVar2 == 0) {
        iVar1 = (int)local_30;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar1;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

int Device::getAvailableModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);
  size_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (event != 0)
  {
    if (gentl->EventGetInfo(event, GenTL::EVENT_NUM_IN_QUEUE, &type, &ret, &size) != GenTL::GC_ERR_SUCCESS)
    {
      ret=0;
    }
  }

  return static_cast<int>(ret);
}